

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v6::internal::
     parse_format_string<false,wchar_t,fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&>
               (basic_string_view<wchar_t> format_str,
               format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
               *handler)

{
  bool bVar1;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *this;
  size_t sVar2;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_RDX;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_RDI;
  wchar_t c;
  wchar_t *p;
  wchar_t *end;
  wchar_t *begin;
  pfs_writer write;
  wchar_t *in_stack_00000058;
  wchar_t *in_stack_00000060;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_00000068;
  wchar_t local_54;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *in_stack_ffffffffffffffc0;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *pfVar3;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *local_38;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *last;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *handler_00;
  format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
  *pfVar4;
  
  pfVar4 = in_RDX;
  this = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *)basic_string_view<wchar_t>::data((basic_string_view<wchar_t> *)&stack0xfffffffffffffff0)
  ;
  pfVar3 = this;
  sVar2 = basic_string_view<wchar_t>::size((basic_string_view<wchar_t> *)&stack0xfffffffffffffff0);
  last = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          *)((long)&this->field_0x0 + sVar2 * 4);
  local_38 = pfVar3;
  do {
    if (local_38 == last) {
      return;
    }
    local_54 = in_stack_ffffffffffffffbc;
    pfVar3 = in_stack_ffffffffffffffc0;
    handler_00 = local_38;
    if ((*(int *)local_38 != 0x7b) &&
       (bVar1 = find<false,char,wchar_t_const*>
                          ((wchar_t *)local_38,(wchar_t *)last,'{',(wchar_t **)&local_38),
       local_54 = in_stack_ffffffffffffffbc, pfVar3 = in_stack_ffffffffffffffc0, !bVar1)) {
      parse_format_string<false,_wchar_t,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&>
      ::pfs_writer::operator()
                ((pfs_writer *)in_stack_ffffffffffffffc0,
                 (wchar_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (wchar_t *)this);
      return;
    }
    in_stack_ffffffffffffffc0 = pfVar4;
    parse_format_string<false,_wchar_t,_fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&>
    ::pfs_writer::operator()
              ((pfs_writer *)pfVar3,(wchar_t *)CONCAT44(local_54,in_stack_ffffffffffffffb8),
               (wchar_t *)this);
    local_38 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                *)&local_38->field_0x4;
    if (local_38 == last) {
      error_handler::on_error
                ((error_handler *)pfVar3,(char *)CONCAT44(local_54,in_stack_ffffffffffffffb8));
    }
    if ((char)*(undefined4 *)local_38 == '}') {
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
      ::on_arg_id(this);
      pfVar4 = in_stack_ffffffffffffffc0;
      format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
      ::on_replacement_field(in_RDI,(wchar_t *)in_stack_ffffffffffffffc0);
      in_stack_ffffffffffffffc0 = pfVar3;
    }
    else {
      pfVar4 = in_stack_ffffffffffffffc0;
      if (*(int *)local_38 == 0x7b) {
        format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
        ::on_text(in_RDX,(wchar_t *)handler_00,(wchar_t *)last);
        in_stack_ffffffffffffffc0 = pfVar3;
      }
      else {
        local_38 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                    *)parse_arg_id<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>>
                                ((wchar_t *)in_stack_ffffffffffffffc0,(wchar_t *)in_RDX,
                                 (id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                                  *)handler_00);
        if (local_38 == last) {
          local_54 = L'\0';
        }
        else {
          local_54 = *(wchar_t *)local_38;
        }
        if (local_54 == L'}') {
          format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
          ::on_replacement_field(in_RDI,(wchar_t *)pfVar4);
        }
        else {
          if (local_54 != L':') {
            error_handler::on_error
                      ((error_handler *)in_stack_ffffffffffffffc0,
                       (char *)CONCAT44(local_54,in_stack_ffffffffffffffb8));
          }
          local_38 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                      *)format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                        ::on_format_specs(in_stack_00000068,in_stack_00000060,in_stack_00000058);
          if ((local_38 == last) || (*(wchar_t *)local_38 != L'}')) {
            error_handler::on_error
                      ((error_handler *)in_stack_ffffffffffffffc0,
                       (char *)CONCAT44(local_54,in_stack_ffffffffffffffb8));
          }
        }
      }
    }
    local_38 = (format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>
                *)&local_38->field_0x4;
    in_stack_ffffffffffffffbc = local_54;
  } while( true );
}

Assistant:

FMT_CONSTEXPR void parse_format_string(basic_string_view<Char> format_str,
                                       Handler&& handler) {
  struct pfs_writer {
    FMT_CONSTEXPR void operator()(const Char* begin, const Char* end) {
      if (begin == end) return;
      for (;;) {
        const Char* p = nullptr;
        if (!find<IS_CONSTEXPR>(begin, end, '}', p))
          return handler_.on_text(begin, end);
        ++p;
        if (p == end || *p != '}')
          return handler_.on_error("unmatched '}' in format string");
        handler_.on_text(begin, p);
        begin = p + 1;
      }
    }
    Handler& handler_;
  } write{handler};
  auto begin = format_str.data();
  auto end = begin + format_str.size();
  while (begin != end) {
    // Doing two passes with memchr (one for '{' and another for '}') is up to
    // 2.5x faster than the naive one-pass implementation on big format strings.
    const Char* p = begin;
    if (*begin != '{' && !find<IS_CONSTEXPR>(begin, end, '{', p))
      return write(begin, end);
    write(begin, p);
    ++p;
    if (p == end) return handler.on_error("invalid format string");
    if (static_cast<char>(*p) == '}') {
      handler.on_arg_id();
      handler.on_replacement_field(p);
    } else if (*p == '{') {
      handler.on_text(p, p + 1);
    } else {
      p = parse_arg_id(p, end, id_adapter<Handler, Char>{handler});
      Char c = p != end ? *p : Char();
      if (c == '}') {
        handler.on_replacement_field(p);
      } else if (c == ':') {
        p = handler.on_format_specs(p + 1, end);
        if (p == end || *p != '}')
          return handler.on_error("unknown format specifier");
      } else {
        return handler.on_error("missing '}' in format string");
      }
    }
    begin = p + 1;
  }
}